

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
::destroy_buckets(table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                  *this)

{
  bucket_pointer ppVar1;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  *in_RDI;
  bucket_pointer it;
  bucket_pointer end;
  bucket_allocator *in_stack_ffffffffffffffd8;
  bucket_pointer local_18;
  
  ppVar1 = get_bucket(in_RDI,in_RDI->bucket_count_ + 1);
  for (local_18 = in_RDI->buckets_; local_18 != ppVar1; local_18 = local_18 + 1) {
    in_stack_ffffffffffffffd8 =
         bucket_alloc((table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                       *)0x8d899c);
    addressof<boost::unordered::detail::ptr_bucket>((ptr_bucket *)in_RDI);
    allocator_traits<std::allocator<boost::unordered::detail::ptr_bucket>_>::
    destroy<boost::unordered::detail::ptr_bucket>
              ((allocator<boost::unordered::detail::ptr_bucket> *)in_RDI,
               (ptr_bucket *)in_stack_ffffffffffffffd8);
  }
  bucket_alloc((table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                *)0x8d89d0);
  allocator_traits<std::allocator<boost::unordered::detail::ptr_bucket>_>::deallocate
            ((allocator<boost::unordered::detail::ptr_bucket> *)in_RDI,
             (pointer)in_stack_ffffffffffffffd8,0x8d89e9);
  return;
}

Assistant:

void destroy_buckets()
        {
            bucket_pointer end = get_bucket(bucket_count_ + 1);
            for(bucket_pointer it = buckets_; it != end; ++it)
            {
                bucket_allocator_traits::destroy(bucket_alloc(),
                    boost::addressof(*it));
            }

            bucket_allocator_traits::deallocate(bucket_alloc(),
                buckets_, bucket_count_ + 1);
        }